

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchableObjectHolder.hpp
# Opt level: O2

bool __thiscall
gmlc::concurrency::
SearchableObjectHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
::removeObject(SearchableObjectHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
               *this,string *name)

{
  _Rb_tree_header *p_Var1;
  iterator __position;
  iterator __position_00;
  
  std::mutex::lock(&this->mapLock);
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::find(&(this->objectMap)._M_t,name);
  p_Var1 = &(this->objectMap)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<std::__cxx11::string>>>>
    ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<std::__cxx11::string>>>>
                        *)&this->objectMap,__position);
    __position_00 =
         std::
         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
         ::find(&(this->typeMap)._M_t,name);
    if ((_Rb_tree_header *)__position_00._M_node !=
        &(this->typeMap)._M_t._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
      ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
                          *)&this->typeMap,__position_00);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return (_Rb_tree_header *)__position._M_node != p_Var1;
}

Assistant:

bool removeObject(const std::string& name)
    {
        std::lock_guard<std::mutex> lock(mapLock);
        auto fnd = objectMap.find(name);
        if (fnd != objectMap.end()) {
            objectMap.erase(fnd);
            auto fnd2 = typeMap.find(name);
            if (fnd2 != typeMap.end()) {
                typeMap.erase(fnd2);
            }
            return true;
        }

        return false;
    }